

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::unregisterTopLevelItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  int iVar1;
  long lVar2;
  QGraphicsItemPrivate *pQVar3;
  qsizetype qVar4;
  QList<QGraphicsItem_*> *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem **in_stack_ffffffffffffffc8;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffd0;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)(in_RDI + 0xb8) >> 6 & 1) == 0) {
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    iVar1 = pQVar3->siblingIndex;
    qVar4 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x148));
    *(uint *)(in_RDI + 0xb8) =
         *(uint *)(in_RDI + 0xb8) & 0xffffffbf | (uint)((long)iVar1 != qVar4 + -1) << 6;
  }
  if (((*(uint *)(in_RDI + 0xb8) >> 7 & 1) == 0) || ((*(uint *)(in_RDI + 0xb8) >> 6 & 1) != 0)) {
    QList<QGraphicsItem*>::removeOne<QGraphicsItem*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    this_00 = (QList<QGraphicsItem_*> *)(in_RDI + 0x148);
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QList<QGraphicsItem_*>::removeAt(this_00,(qsizetype)in_stack_ffffffffffffffc8);
  }
  pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RSI + 8));
  pQVar3->siblingIndex = -1;
  if ((*(uint *)(in_RDI + 0xb8) >> 7 & 1) != 0) {
    *(uint *)(in_RDI + 0xb8) =
         *(uint *)(in_RDI + 0xb8) & 0xffffff7f |
         (uint)((*(uint *)(in_RDI + 0xb8) >> 6 & 1) == 0) << 7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::unregisterTopLevelItem(QGraphicsItem *item)
{
    if (!holesInTopLevelSiblingIndex)
        holesInTopLevelSiblingIndex = item->d_ptr->siblingIndex != topLevelItems.size() - 1;
    if (topLevelSequentialOrdering && !holesInTopLevelSiblingIndex)
        topLevelItems.removeAt(item->d_ptr->siblingIndex);
    else
        topLevelItems.removeOne(item);
    // NB! Do not use topLevelItems.removeAt(item->d_ptr->siblingIndex) because
    // the item is not guaranteed to be at the index after the list is sorted
    // (see ensureSortedTopLevelItems()).
    item->d_ptr->siblingIndex = -1;
    if (topLevelSequentialOrdering)
        topLevelSequentialOrdering = !holesInTopLevelSiblingIndex;
}